

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

void __thiscall
glcts::ProgramUniformCase::generateUniformFragSrc
          (ProgramUniformCase *this,string *outFragSrc,GLSLVersion glslVersion,DataType dType)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var4;
  string local_530;
  allocator<char> local_509;
  string local_508 [32];
  string local_4e8;
  undefined1 local_4c8 [8];
  StringTemplate fragTmpl;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_498;
  _Base_ptr local_458;
  undefined1 local_450;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_448;
  _Base_ptr local_408;
  undefined1 local_400;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f8;
  _Base_ptr local_3b8;
  undefined1 local_3b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a8;
  _Base_ptr local_368;
  undefined1 local_360;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_358;
  _Base_ptr local_318;
  undefined1 local_310;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  _Base_ptr local_2c8;
  undefined1 local_2c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8;
  _Base_ptr local_278;
  undefined1 local_270;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_268;
  _Base_ptr local_228;
  undefined1 local_220;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  undefined1 local_1d8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  undefined1 local_198 [8];
  ostringstream fragSrc;
  DataType dType_local;
  GLSLVersion glslVersion_local;
  string *outFragSrc_local;
  ProgramUniformCase *this_local;
  
  fragSrc._368_4_ = dType;
  fragSrc._372_4_ = glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  pcVar2 = glu::getGLSLVersionDeclaration(fragSrc._372_4_);
  poVar3 = std::operator<<((ostream *)local_198,pcVar2);
  std::operator<<(poVar3,"\n");
  bVar1 = glu::isDataTypeMatrix(fragSrc._368_4_);
  if ((bVar1) && (bVar1 = isDataTypeSquareMatrix(this,fragSrc._368_4_), bVar1)) {
    std::operator<<((ostream *)local_198,s_unifFragSquareMatShaderSrc);
  }
  else {
    bVar1 = glu::isDataTypeMatrix(fragSrc._368_4_);
    if ((!bVar1) || (bVar1 = isDataTypeSquareMatrix(this,fragSrc._368_4_), bVar1)) {
      std::operator<<((ostream *)local_198,s_unifFragShaderSrc);
    }
    else {
      std::operator<<((ostream *)local_198,s_unifFragNonSquareMatShaderSrc);
    }
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_1d8);
  if (fragSrc._368_4_ == 0x1b) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[12],_const_char_(&)[4],_true>
              (&local_218,(char (*) [12])"SCALAR_TYPE",(char (*) [4])0x2bf05b0);
    _Var4 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_1d8,&local_218);
    local_228 = (_Base_ptr)_Var4.first._M_node;
    local_220 = _Var4.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_218);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[12],_const_char_(&)[5],_true>
              (&local_268,(char (*) [12])"VECTOR_TYPE",(char (*) [5])0x2b9c525);
    _Var4 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_1d8,&local_268);
    local_278 = (_Base_ptr)_Var4.first._M_node;
    local_270 = _Var4.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_268);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[4],_const_char_(&)[1],_true>
              (&local_2b8,(char (*) [4])"SFX",(char (*) [1])"");
    _Var4 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_1d8,&local_2b8);
    local_2c8 = (_Base_ptr)_Var4.first._M_node;
    local_2c0 = _Var4.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_2b8);
  }
  else if (fragSrc._368_4_ == 0x1f) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[12],_const_char_(&)[5],_true>
              (&local_308,(char (*) [12])"SCALAR_TYPE",(char (*) [5])0x2a49c1b);
    _Var4 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_1d8,&local_308);
    local_318 = (_Base_ptr)_Var4.first._M_node;
    local_310 = _Var4.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_308);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[12],_const_char_(&)[5],_true>
              (&local_358,(char (*) [12])"VECTOR_TYPE",(char (*) [5])0x2bf706c);
    _Var4 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_1d8,&local_358);
    local_368 = (_Base_ptr)_Var4.first._M_node;
    local_360 = _Var4.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_358);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[4],_const_char_(&)[2],_true>
              (&local_3a8,(char (*) [4])"SFX",(char (*) [2])0x2a87631);
    _Var4 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_1d8,&local_3a8);
    local_3b8 = (_Base_ptr)_Var4.first._M_node;
    local_3b0 = _Var4.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_3a8);
  }
  else if (fragSrc._368_4_ == 1) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[12],_const_char_(&)[6],_true>
              (&local_3f8,(char (*) [12])"SCALAR_TYPE",(char (*) [6])0x2a7e3b8);
    _Var4 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_1d8,&local_3f8);
    local_408 = (_Base_ptr)_Var4.first._M_node;
    local_400 = _Var4.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_3f8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[12],_const_char_(&)[4],_true>
              (&local_448,(char (*) [12])"VECTOR_TYPE",(char (*) [4])0x2b6d3ea);
    _Var4 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_1d8,&local_448);
    local_458 = (_Base_ptr)_Var4.first._M_node;
    local_450 = _Var4.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_448);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[4],_const_char_(&)[3],_true>
              (&local_498,(char (*) [4])"SFX",(char (*) [3])0x2be2682);
    _Var4 = std::
            map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_1d8,&local_498);
    fragTmpl.m_template.field_2._8_8_ = _Var4.first._M_node;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_498);
  }
  std::__cxx11::ostringstream::str();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,pcVar2,&local_509);
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_4c8,&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator(&local_509);
  std::__cxx11::string::~string(local_508);
  tcu::StringTemplate::specialize
            (&local_530,(StringTemplate *)local_4c8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1d8);
  std::__cxx11::string::operator=((string *)outFragSrc,(string *)&local_530);
  std::__cxx11::string::~string((string *)&local_530);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_4c8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return;
}

Assistant:

void generateUniformFragSrc(std::string& outFragSrc, glu::GLSLVersion glslVersion, glu::DataType dType)
	{
		std::ostringstream fragSrc;

		fragSrc << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
		if (isDataTypeMatrix(dType) && isDataTypeSquareMatrix(dType))
		{
			fragSrc << s_unifFragSquareMatShaderSrc;
		}
		else if (isDataTypeMatrix(dType) && !isDataTypeSquareMatrix(dType))
		{
			fragSrc << s_unifFragNonSquareMatShaderSrc;
		}
		else
		{
			fragSrc << s_unifFragShaderSrc;
		}

		std::map<std::string, std::string> params;

		if (dType == glu::TYPE_INT)
		{
			params.insert(std::pair<std::string, std::string>("SCALAR_TYPE", "int"));
			params.insert(std::pair<std::string, std::string>("VECTOR_TYPE", "ivec"));
			params.insert(std::pair<std::string, std::string>("SFX", ""));
		}
		else if (dType == glu::TYPE_UINT)
		{
			params.insert(std::pair<std::string, std::string>("SCALAR_TYPE", "uint"));
			params.insert(std::pair<std::string, std::string>("VECTOR_TYPE", "uvec"));
			params.insert(std::pair<std::string, std::string>("SFX", "u"));
		}
		else if (dType == glu::TYPE_FLOAT)
		{
			params.insert(std::pair<std::string, std::string>("SCALAR_TYPE", "float"));
			params.insert(std::pair<std::string, std::string>("VECTOR_TYPE", "vec"));
			params.insert(std::pair<std::string, std::string>("SFX", ".0"));
		}

		tcu::StringTemplate fragTmpl(fragSrc.str().c_str());
		outFragSrc = fragTmpl.specialize(params);
	}